

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator::GenerateFieldInfo
          (ImmutableMessageOneofFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  OneofDescriptor *this_00;
  int __c;
  char *in_RDX;
  long in_RDI;
  FieldDescriptor *in_stack_00000038;
  char *in_stack_000001c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001c8;
  Printer *in_stack_000001d0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffd8;
  int value;
  
  FieldDescriptor::number(*(FieldDescriptor **)(in_RDI + 8));
  WriteIntToUtf16CharSequence((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
  GetExperimentalJavaFieldType(in_stack_00000038);
  WriteIntToUtf16CharSequence((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
  this_00 = FieldDescriptor::containing_oneof(*(FieldDescriptor **)(in_RDI + 8));
  value = (int)((ulong)in_RDI >> 0x20);
  OneofDescriptor::index(this_00,in_RDX,__c);
  WriteIntToUtf16CharSequence(value,in_stack_ffffffffffffffd8);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  return;
}

Assistant:

void ImmutableMessageOneofFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  WriteIntToUtf16CharSequence(descriptor_->containing_oneof()->index(), output);
  printer->Print(variables_, "$oneof_stored_type$.class,\n");
}